

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintNgeneric.cpp
# Opt level: O2

void __thiscall
chrono::ChConstraintNgeneric::Build_CqT
          (ChConstraintNgeneric *this,ChSparseMatrix *storage,int inscol)

{
  pointer ppCVar1;
  ulong uVar2;
  long lVar3;
  long local_78;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_70;
  
  lVar3 = 0;
  for (uVar2 = 0;
      ppCVar1 = (this->variables).
                super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->variables).
                            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3);
      uVar2 = uVar2 + 1) {
    if (ppCVar1[uVar2]->disabled == false) {
      local_78 = (long)&(((this->Cq).
                          super__Vector_base<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_std::allocator<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).m_storage.
                        m_data + lVar3;
      Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
      Ref<Eigen::Transpose<Eigen::Matrix<double,1,_1,1,1,_1>>>
                ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_70
                 ,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_> *)&local_78
                 ,(type *)0x0);
      PasteMatrix(storage,&local_70,
                  (this->variables).
                  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar2]->offset,inscol,true);
      Eigen::internal::handmade_aligned_free
                (local_70.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_data);
    }
    lVar3 = lVar3 + 0x10;
  }
  return;
}

Assistant:

void ChConstraintNgeneric::Build_CqT(ChSparseMatrix& storage, int inscol) {
    for (size_t i = 0; i < variables.size(); ++i) {
        if (variables[i]->IsActive())
            PasteMatrix(storage, Cq[i].transpose(), variables[i]->GetOffset(), inscol);
    }
}